

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20.c
# Opt level: O1

int cifra_chacha20poly1305_setup_crypto(ptls_aead_context_t *ctx,int is_enc,void *key,void *iv)

{
  int iVar1;
  st_ptls_aead_algorithm_t *psVar2;
  chacha20poly1305_context_t *ctx_1;
  
  ctx->dispose_crypto = chacha20poly1305_dispose_crypto;
  ctx->do_get_iv = chacha20poly1305_get_iv;
  ctx->do_set_iv = chacha20poly1305_set_iv;
  if (is_enc == 0) {
    ctx->do_encrypt_final = (_func_size_t_st_ptls_aead_context_t_ptr_void_ptr *)0x0;
    ctx->do_encrypt =
         (_func_void_st_ptls_aead_context_t_ptr_void_ptr_void_ptr_size_t_uint64_t_void_ptr_size_t_ptls_aead_supplementary_encryption_t_ptr
          *)0x0;
    ctx->do_encrypt_init = (_func_void_st_ptls_aead_context_t_ptr_uint64_t_void_ptr_size_t *)0x0;
    ctx->do_encrypt_update = (_func_size_t_st_ptls_aead_context_t_ptr_void_ptr_void_ptr_size_t *)0x0
    ;
    ctx->do_encrypt_v =
         (_func_void_st_ptls_aead_context_t_ptr_void_ptr_ptls_iovec_t_ptr_size_t_uint64_t_void_ptr_size_t
          *)0x0;
    ctx->do_decrypt = chacha20poly1305_decrypt;
  }
  else {
    ctx->do_encrypt_init = chacha20poly1305_init;
    ctx->do_encrypt_update = chacha20poly1305_encrypt_update;
    ctx->do_encrypt_final = chacha20poly1305_encrypt_final;
    ctx->do_encrypt = ptls_aead__do_encrypt;
    ctx->do_encrypt_v = ptls_aead__do_encrypt_v;
    ctx->do_decrypt =
         (_func_size_t_st_ptls_aead_context_t_ptr_void_ptr_void_ptr_size_t_uint64_t_void_ptr_size_t
          *)0x0;
  }
  psVar2 = (st_ptls_aead_algorithm_t *)ptls_cipher_new(&ptls_minicrypto_chacha20,is_enc,key);
  ctx[1].algo = psVar2;
  if (psVar2 == (st_ptls_aead_algorithm_t *)0x0) {
    iVar1 = 0x203;
  }
  else {
    *(undefined4 *)&ctx[1].do_get_iv = *(undefined4 *)((long)iv + 8);
    ctx[1].dispose_crypto = *iv;
    ctx[1].do_encrypt_update = cifra_poly1305_init;
    ctx[1].do_encrypt_final = cifra_poly1305_update;
    ctx[1].do_encrypt = cifra_poly1305_finish;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int cifra_chacha20poly1305_setup_crypto(ptls_aead_context_t *ctx, int is_enc, const void *key, const void *iv)
{
    return chacha20poly1305_setup_crypto(ctx, is_enc, key, iv, &ptls_minicrypto_chacha20, cifra_poly1305_init,
                                         cifra_poly1305_update, cifra_poly1305_finish);
}